

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadNodeTransformation(ColladaParser *this,Node *pNode,TransformType pType)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pName;
  uint local_d4;
  char *pcStack_d0;
  uint a;
  char *content;
  undefined1 local_c0 [4];
  int indexSID;
  Transform tf;
  allocator<char> local_41;
  string local_40 [8];
  string tagName;
  TransformType pType_local;
  Node *pNode_local;
  ColladaParser *this_local;
  
  tagName.field_2._12_4_ = pType;
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar1 & 1) == 0) {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,(char *)CONCAT44(extraout_var,iVar2),&local_41);
    std::allocator<char>::~allocator(&local_41);
    Collada::Transform::Transform((Transform *)local_c0);
    tf.mID.field_2._8_4_ = tagName.field_2._12_4_;
    content._4_4_ = TestAttribute(this,"sid");
    if (-1 < (int)content._4_4_) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)content._4_4_);
      std::__cxx11::string::operator=((string *)local_c0,(char *)CONCAT44(extraout_var_00,iVar2));
    }
    pcStack_d0 = GetTextContent(this);
    for (local_d4 = 0;
        local_d4 < ReadNodeTransformation::sNumParameters[(uint)tagName.field_2._12_4_];
        local_d4 = local_d4 + 1) {
      pcStack_d0 = fast_atoreal_move<float>(pcStack_d0,tf.f + ((ulong)local_d4 - 2),true);
      SkipSpacesAndLineEnd<char>(&stack0xffffffffffffff30);
    }
    std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::push_back
              (&pNode->mTransforms,(value_type *)local_c0);
    pName = (char *)std::__cxx11::string::c_str();
    TestClosing(this,pName);
    Collada::Transform::~Transform((Transform *)local_c0);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void ColladaParser::ReadNodeTransformation(Node* pNode, TransformType pType)
{
    if (mReader->isEmptyElement())
        return;

    std::string tagName = mReader->getNodeName();

    Transform tf;
    tf.mType = pType;

    // read SID
    int indexSID = TestAttribute("sid");
    if (indexSID >= 0)
        tf.mID = mReader->getAttributeValue(indexSID);

    // how many parameters to read per transformation type
    static const unsigned int sNumParameters[] = { 9, 4, 3, 3, 7, 16 };
    const char* content = GetTextContent();

    // read as many parameters and store in the transformation
    for (unsigned int a = 0; a < sNumParameters[pType]; a++)
    {
        // read a number
        content = fast_atoreal_move<ai_real>(content, tf.f[a]);
        // skip whitespace after it
        SkipSpacesAndLineEnd(&content);
    }

    // place the transformation at the queue of the node
    pNode->mTransforms.push_back(tf);

    // and consume the closing tag
    TestClosing(tagName.c_str());
}